

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  short sVar12;
  uint uVar13;
  long in_FS_OFFSET;
  
  if ((j->code_bits < 0x10) && (stbi__grow_buffer_unsafe(j), j->code_bits < 0x10)) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar8 = j->code_buffer;
  uVar11 = (ulong)hdc->fast[uVar8 >> 0x17];
  if (uVar11 == 0xff) {
    lVar10 = 0;
    do {
      lVar9 = lVar10;
      lVar10 = lVar9 + 1;
    } while (hdc->maxcode[lVar9 + 10] <= uVar8 >> 0x10);
    iVar4 = j->code_bits;
    if (lVar10 == 8) {
LAB_00120c82:
      j->code_bits = iVar4 + -0x10;
      goto LAB_00120d05;
    }
    if (iVar4 < (int)(lVar9 + 10)) goto LAB_00120d05;
    uVar11 = (ulong)(int)((uVar8 >> (0x17U - (char)lVar10 & 0x1f) & stbi__bmask[lVar9 + 10]) +
                         hdc->delta[lVar9 + 10]);
    if ((uVar8 >> (-hdc->size[uVar11] & 0x1f) & stbi__bmask[hdc->size[uVar11]]) !=
        (uint)hdc->code[uVar11]) {
LAB_00121020:
      __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/knosvoxel[P]OpenGL-Project-Template/include/stb_image/stb_image.h"
                    ,0x843,"int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)");
    }
    j->code_bits = (iVar4 - (int)lVar10) + -9;
    j->code_buffer = uVar8 << ((byte)(lVar9 + 10) & 0x1f);
  }
  else {
    bVar1 = hdc->size[uVar11];
    if (j->code_bits < (int)(uint)bVar1) goto LAB_00120d05;
    j->code_buffer = uVar8 << (bVar1 & 0x1f);
    j->code_bits = j->code_bits - (uint)bVar1;
  }
  bVar1 = hdc->values[uVar11];
  if (bVar1 < 0x10) {
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    iVar6 = j->code_bits;
    if (bVar1 == 0) {
      iVar4 = 0;
    }
    else {
      if (iVar6 < (int)(uint)bVar1) {
        stbi__grow_buffer_unsafe(j);
        iVar6 = j->code_bits;
      }
      uVar8 = j->code_buffer;
      uVar3 = uVar8 << (bVar1 & 0x1f) | uVar8 >> 0x20 - (bVar1 & 0x1f);
      uVar13 = *(uint *)((long)stbi__bmask + (ulong)((uint)bVar1 * 4));
      j->code_buffer = ~uVar13 & uVar3;
      iVar6 = iVar6 - (uint)bVar1;
      j->code_bits = iVar6;
      iVar4 = 0;
      if (-1 < (int)uVar8) {
        iVar4 = *(int *)((long)stbi__jbias + (ulong)((uint)bVar1 * 4));
      }
      iVar4 = iVar4 + (uVar13 & uVar3);
    }
    iVar4 = iVar4 + j->img_comp[b].dc_pred;
    j->img_comp[b].dc_pred = iVar4;
    *data = (short)iVar4 * *dequant;
    iVar7 = 1;
    do {
      if (iVar6 < 0x10) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar8 = j->code_buffer;
      uVar11 = (ulong)(uVar8 >> 0x17);
      uVar2 = fac[uVar11];
      if (uVar2 == 0) {
        if (j->code_bits < 0x10) {
          stbi__grow_buffer_unsafe(j);
          uVar8 = j->code_buffer;
          uVar11 = (ulong)(uVar8 >> 0x17);
        }
        uVar11 = (ulong)hac->fast[uVar11];
        if (uVar11 == 0xff) {
          lVar10 = 0;
          do {
            lVar9 = lVar10;
            lVar10 = lVar9 + 1;
          } while (hac->maxcode[lVar9 + 10] <= uVar8 >> 0x10);
          iVar4 = j->code_bits;
          if (lVar10 == 8) goto LAB_00120c82;
          if (iVar4 < (int)(lVar9 + 10)) break;
          uVar11 = (ulong)(int)((uVar8 >> (0x17U - (char)lVar10 & 0x1f) & stbi__bmask[lVar9 + 10]) +
                               hac->delta[lVar9 + 10]);
          if ((uVar8 >> (-hac->size[uVar11] & 0x1f) & stbi__bmask[hac->size[uVar11]]) !=
              (uint)hac->code[uVar11]) goto LAB_00121020;
          iVar6 = (iVar4 - (int)lVar10) + -9;
          j->code_bits = (iVar4 - (int)lVar10) + -9;
          uVar8 = uVar8 << ((byte)(lVar9 + 10) & 0x1f);
          j->code_buffer = uVar8;
        }
        else {
          bVar1 = hac->size[uVar11];
          iVar6 = j->code_bits - (uint)bVar1;
          if (j->code_bits < (int)(uint)bVar1) break;
          uVar8 = uVar8 << (bVar1 & 0x1f);
          j->code_buffer = uVar8;
          j->code_bits = iVar6;
        }
        bVar1 = hac->values[uVar11];
        uVar13 = bVar1 & 0xf;
        if ((bVar1 & 0xf) == 0) {
          if (bVar1 != 0xf0) {
            return 1;
          }
          iVar7 = iVar7 + 0x10;
        }
        else {
          lVar10 = (long)iVar7 + (ulong)(bVar1 >> 4);
          bVar1 = ""[lVar10];
          if (iVar6 < (int)uVar13) {
            stbi__grow_buffer_unsafe(j);
            uVar8 = j->code_buffer;
            iVar6 = j->code_bits;
          }
          uVar5 = uVar8 << (sbyte)uVar13 | uVar8 >> 0x20 - (sbyte)uVar13;
          uVar3 = *(uint *)((long)stbi__bmask + (ulong)(uVar13 << 2));
          j->code_buffer = ~uVar3 & uVar5;
          iVar6 = iVar6 - uVar13;
          j->code_bits = iVar6;
          sVar12 = 0;
          if (-1 < (int)uVar8) {
            sVar12 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar13 << 2));
          }
          iVar7 = (int)lVar10 + 1;
          *(ushort *)((long)data + (ulong)((uint)bVar1 * 2)) =
               (((ushort)uVar5 & (ushort)uVar3) + sVar12) *
               *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
        }
      }
      else {
        lVar10 = (long)iVar7 + (ulong)(uVar2 >> 4 & 0xf);
        j->code_buffer = uVar8 << (sbyte)(uVar2 & 0xf);
        iVar6 = j->code_bits - (uVar2 & 0xf);
        j->code_bits = iVar6;
        iVar7 = (int)lVar10 + 1;
        *(short *)((long)data + (ulong)((uint)""[lVar10] * 2)) =
             (short)(char)(uVar2 >> 8) * *(short *)((long)dequant + (ulong)((uint)""[lVar10] * 2));
      }
      if (0x3f < iVar7) {
        return 1;
      }
    } while( true );
  }
LAB_00120d05:
  *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0 || t > 15) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}